

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void TPZSkylMatrix<std::complex<long_double>_>::InitializeElem
               (TPZVec<long> *skyline,TPZVec<std::complex<long_double>_> *storage,
               TPZVec<std::complex<long_double>_*> *point)

{
  complex<long_double> *pcVar1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  longdouble local_48;
  longdouble local_38;
  
  lVar5 = skyline->fNElements;
  iVar2 = NumElements(skyline);
  (*storage->_vptr_TPZVec[3])(storage,iVar2);
  local_48 = (longdouble)0;
  local_38 = local_48;
  TPZVec<std::complex<long_double>_>::Fill(storage,(complex<long_double> *)&local_48,0,-1);
  (*point->_vptr_TPZVec[3])(point,lVar5 + 1);
  if (lVar5 == 0) {
    *point->fStore = (complex<long_double> *)0x0;
  }
  else {
    pcVar1 = storage->fStore;
    *point->fStore = pcVar1;
    point->fStore[lVar5] = pcVar1 + iVar2;
  }
  lVar3 = 0;
  if (lVar5 < 1) {
    lVar5 = lVar3;
  }
  lVar4 = 0x20;
  for (; lVar5 != lVar3; lVar3 = lVar3 + 1) {
    point->fStore[lVar3 + 1] =
         (complex<long_double> *)(point->fStore[lVar3][-skyline->fStore[lVar3]]._M_value + lVar4);
    lVar4 = lVar4 + 0x20;
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::InitializeElem(const TPZVec<int64_t> &skyline, TPZVec<TVar> &storage, TPZVec<TVar *> &point) {   // JORGE 2013 OUTUBRO ???
	int64_t dim = skyline.NElements();
	int64_t nel = NumElements(skyline);
#ifdef PZDEBUG
    //	std::cout << "Skyline Matrix, Number of elements : " << nel << " in floating point " << nel*sizeof(TVar) << std::endl;
#endif
	storage.Resize(nel);
	storage.Fill(0.);
	int64_t i;
	point.Resize(dim+1);
	if(dim) {
		point[0] = &storage[0];
		point[dim] = &storage[0]+nel;
	} else {
		point[0] = 0;
	}
	for(i=1; i<dim+1; i++)
		point[i] = point[i-1]+(i-1)-skyline[i-1]+1;
}